

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::timestamp_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::timestamp_t,_duckdb::hugeint_t> *state,timestamp_t *x,
               hugeint_t *y,AggregateBinaryInput *binary)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
    (state->arg).value = x->value;
    iVar4 = y->upper;
    (state->value).lower = y->lower;
    (state->value).upper = iVar4;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
    return;
  }
  uVar1 = y->lower;
  lVar2 = y->upper;
  lVar3 = (state->value).upper;
  if ((lVar2 <= lVar3) && (uVar1 <= (state->value).lower || lVar3 != lVar2)) {
    return;
  }
  (state->arg).value = x->value;
  (state->value).lower = uVar1;
  (state->value).upper = lVar2;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}